

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::InternalSwap
          (SentencePieceText_SentencePiece *this,SentencePieceText_SentencePiece *other)

{
  bool bVar1;
  InternalMetadata *this_00;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar2;
  ArenaStringPtr *pAVar3;
  ArenaStringPtr *pAVar4;
  string *psVar5;
  Arena *pAVar6;
  InternalMetadata *this_01;
  SentencePieceText_SentencePiece *other_local;
  SentencePieceText_SentencePiece *this_local;
  string *local_a0;
  string *other_ptr_1;
  string *this_ptr_1;
  string *other_ptr;
  string *this_ptr;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_01 = &(this->super_MessageLite)._internal_metadata_;
  this_00 = &(other->super_MessageLite)._internal_metadata_;
  if ((((uint)this_01->ptr_ & 1) == 1) || (((uint)this_00->ptr_ & 1) == 1)) {
    if (((uint)this_00->ptr_ & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         (this_00);
      local_a0 = &pCVar2->unknown_fields;
    }
    else {
      local_a0 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>(this_01,local_a0);
  }
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  pAVar3 = &this->piece_;
  pAVar4 = &other->piece_;
  psVar5 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  pAVar6 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(pAVar3,psVar5);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(pAVar4,psVar5), !bVar1)) {
    if (psVar5 == (string *)0x0) {
      std::swap<google::protobuf::internal::TaggedPtr<std::__cxx11::string>>
                (&pAVar3->tagged_ptr_,&pAVar4->tagged_ptr_);
    }
    else {
      psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar3,pAVar6);
      google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar4,pAVar6);
      std::__cxx11::string::swap((string *)psVar5);
    }
  }
  pAVar3 = &this->surface_;
  pAVar4 = &other->surface_;
  psVar5 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  pAVar6 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(pAVar3,psVar5);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(pAVar4,psVar5), !bVar1)) {
    if (psVar5 == (string *)0x0) {
      std::swap<google::protobuf::internal::TaggedPtr<std::__cxx11::string>>
                (&pAVar3->tagged_ptr_,&pAVar4->tagged_ptr_);
    }
    else {
      psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar3,pAVar6);
      google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar4,pAVar6);
      std::__cxx11::string::swap((string *)psVar5);
    }
  }
  google::protobuf::internal::memswap<12>((char *)&this->id_,(char *)&other->id_);
  return;
}

Assistant:

void SentencePieceText_SentencePiece::InternalSwap(SentencePieceText_SentencePiece* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  piece_.Swap(&other->piece_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  surface_.Swap(&other->surface_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(SentencePieceText_SentencePiece, end_)
      + sizeof(SentencePieceText_SentencePiece::end_)
      - PROTOBUF_FIELD_OFFSET(SentencePieceText_SentencePiece, id_)>(
          reinterpret_cast<char*>(&id_),
          reinterpret_cast<char*>(&other->id_));
}